

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSHelper.h
# Opt level: O3

Material * __thiscall Assimp::D3DS::Material::operator=(Material *this,Material *other)

{
  ai_real aVar1;
  ai_real aVar2;
  ai_real aVar3;
  ai_real aVar4;
  aiTextureMapMode aVar5;
  bool bVar6;
  undefined3 uVar7;
  int iVar8;
  
  if (this != other) {
    std::__cxx11::string::operator=((string *)&this->mName,(string *)&other->mName);
    (this->mDiffuse).r = (other->mDiffuse).r;
    (this->mDiffuse).g = (other->mDiffuse).g;
    (this->mDiffuse).b = (other->mDiffuse).b;
    this->mSpecularExponent = other->mSpecularExponent;
    this->mShininessStrength = other->mShininessStrength;
    (this->mSpecular).r = (other->mSpecular).r;
    (this->mSpecular).g = (other->mSpecular).g;
    (this->mSpecular).b = (other->mSpecular).b;
    (this->mAmbient).r = (other->mAmbient).r;
    (this->mAmbient).g = (other->mAmbient).g;
    (this->mAmbient).b = (other->mAmbient).b;
    this->mShading = other->mShading;
    this->mTransparency = other->mTransparency;
    (this->sTexDiffuse).mTextureBlend = (other->sTexDiffuse).mTextureBlend;
    std::__cxx11::string::operator=
              ((string *)&(this->sTexDiffuse).mMapName,(string *)&(other->sTexDiffuse).mMapName);
    aVar1 = (other->sTexDiffuse).mOffsetV;
    aVar2 = (other->sTexDiffuse).mScaleU;
    aVar3 = (other->sTexDiffuse).mScaleV;
    aVar4 = (other->sTexDiffuse).mRotation;
    aVar5 = (other->sTexDiffuse).mMapMode;
    bVar6 = (other->sTexDiffuse).bPrivate;
    uVar7 = *(undefined3 *)&(other->sTexDiffuse).field_0x41;
    iVar8 = (other->sTexDiffuse).iUVSrc;
    (this->sTexDiffuse).mOffsetU = (other->sTexDiffuse).mOffsetU;
    (this->sTexDiffuse).mOffsetV = aVar1;
    (this->sTexDiffuse).mScaleU = aVar2;
    (this->sTexDiffuse).mScaleV = aVar3;
    (this->sTexDiffuse).mRotation = aVar4;
    (this->sTexDiffuse).mMapMode = aVar5;
    (this->sTexDiffuse).bPrivate = bVar6;
    *(undefined3 *)&(this->sTexDiffuse).field_0x41 = uVar7;
    (this->sTexDiffuse).iUVSrc = iVar8;
    (this->sTexOpacity).mTextureBlend = (other->sTexOpacity).mTextureBlend;
    std::__cxx11::string::operator=
              ((string *)&(this->sTexOpacity).mMapName,(string *)&(other->sTexOpacity).mMapName);
    aVar1 = (other->sTexOpacity).mOffsetV;
    aVar2 = (other->sTexOpacity).mScaleU;
    aVar3 = (other->sTexOpacity).mScaleV;
    aVar4 = (other->sTexOpacity).mRotation;
    aVar5 = (other->sTexOpacity).mMapMode;
    bVar6 = (other->sTexOpacity).bPrivate;
    uVar7 = *(undefined3 *)&(other->sTexOpacity).field_0x41;
    iVar8 = (other->sTexOpacity).iUVSrc;
    (this->sTexOpacity).mOffsetU = (other->sTexOpacity).mOffsetU;
    (this->sTexOpacity).mOffsetV = aVar1;
    (this->sTexOpacity).mScaleU = aVar2;
    (this->sTexOpacity).mScaleV = aVar3;
    (this->sTexOpacity).mRotation = aVar4;
    (this->sTexOpacity).mMapMode = aVar5;
    (this->sTexOpacity).bPrivate = bVar6;
    *(undefined3 *)&(this->sTexOpacity).field_0x41 = uVar7;
    (this->sTexOpacity).iUVSrc = iVar8;
    (this->sTexSpecular).mTextureBlend = (other->sTexSpecular).mTextureBlend;
    std::__cxx11::string::operator=
              ((string *)&(this->sTexSpecular).mMapName,(string *)&(other->sTexSpecular).mMapName);
    aVar1 = (other->sTexSpecular).mOffsetV;
    aVar2 = (other->sTexSpecular).mScaleU;
    aVar3 = (other->sTexSpecular).mScaleV;
    aVar4 = (other->sTexSpecular).mRotation;
    aVar5 = (other->sTexSpecular).mMapMode;
    bVar6 = (other->sTexSpecular).bPrivate;
    uVar7 = *(undefined3 *)&(other->sTexSpecular).field_0x41;
    iVar8 = (other->sTexSpecular).iUVSrc;
    (this->sTexSpecular).mOffsetU = (other->sTexSpecular).mOffsetU;
    (this->sTexSpecular).mOffsetV = aVar1;
    (this->sTexSpecular).mScaleU = aVar2;
    (this->sTexSpecular).mScaleV = aVar3;
    (this->sTexSpecular).mRotation = aVar4;
    (this->sTexSpecular).mMapMode = aVar5;
    (this->sTexSpecular).bPrivate = bVar6;
    *(undefined3 *)&(this->sTexSpecular).field_0x41 = uVar7;
    (this->sTexSpecular).iUVSrc = iVar8;
    (this->sTexReflective).mTextureBlend = (other->sTexReflective).mTextureBlend;
    std::__cxx11::string::operator=
              ((string *)&(this->sTexReflective).mMapName,
               (string *)&(other->sTexReflective).mMapName);
    aVar1 = (other->sTexReflective).mOffsetV;
    aVar2 = (other->sTexReflective).mScaleU;
    aVar3 = (other->sTexReflective).mScaleV;
    aVar4 = (other->sTexReflective).mRotation;
    aVar5 = (other->sTexReflective).mMapMode;
    bVar6 = (other->sTexReflective).bPrivate;
    uVar7 = *(undefined3 *)&(other->sTexReflective).field_0x41;
    iVar8 = (other->sTexReflective).iUVSrc;
    (this->sTexReflective).mOffsetU = (other->sTexReflective).mOffsetU;
    (this->sTexReflective).mOffsetV = aVar1;
    (this->sTexReflective).mScaleU = aVar2;
    (this->sTexReflective).mScaleV = aVar3;
    (this->sTexReflective).mRotation = aVar4;
    (this->sTexReflective).mMapMode = aVar5;
    (this->sTexReflective).bPrivate = bVar6;
    *(undefined3 *)&(this->sTexReflective).field_0x41 = uVar7;
    (this->sTexReflective).iUVSrc = iVar8;
    (this->sTexBump).mTextureBlend = (other->sTexBump).mTextureBlend;
    std::__cxx11::string::operator=
              ((string *)&(this->sTexBump).mMapName,(string *)&(other->sTexBump).mMapName);
    aVar1 = (other->sTexBump).mOffsetV;
    aVar2 = (other->sTexBump).mScaleU;
    aVar3 = (other->sTexBump).mScaleV;
    aVar4 = (other->sTexBump).mRotation;
    aVar5 = (other->sTexBump).mMapMode;
    bVar6 = (other->sTexBump).bPrivate;
    uVar7 = *(undefined3 *)&(other->sTexBump).field_0x41;
    iVar8 = (other->sTexBump).iUVSrc;
    (this->sTexBump).mOffsetU = (other->sTexBump).mOffsetU;
    (this->sTexBump).mOffsetV = aVar1;
    (this->sTexBump).mScaleU = aVar2;
    (this->sTexBump).mScaleV = aVar3;
    (this->sTexBump).mRotation = aVar4;
    (this->sTexBump).mMapMode = aVar5;
    (this->sTexBump).bPrivate = bVar6;
    *(undefined3 *)&(this->sTexBump).field_0x41 = uVar7;
    (this->sTexBump).iUVSrc = iVar8;
    (this->sTexEmissive).mTextureBlend = (other->sTexEmissive).mTextureBlend;
    std::__cxx11::string::operator=
              ((string *)&(this->sTexEmissive).mMapName,(string *)&(other->sTexEmissive).mMapName);
    aVar1 = (other->sTexEmissive).mOffsetV;
    aVar2 = (other->sTexEmissive).mScaleU;
    aVar3 = (other->sTexEmissive).mScaleV;
    aVar4 = (other->sTexEmissive).mRotation;
    aVar5 = (other->sTexEmissive).mMapMode;
    bVar6 = (other->sTexEmissive).bPrivate;
    uVar7 = *(undefined3 *)&(other->sTexEmissive).field_0x41;
    iVar8 = (other->sTexEmissive).iUVSrc;
    (this->sTexEmissive).mOffsetU = (other->sTexEmissive).mOffsetU;
    (this->sTexEmissive).mOffsetV = aVar1;
    (this->sTexEmissive).mScaleU = aVar2;
    (this->sTexEmissive).mScaleV = aVar3;
    (this->sTexEmissive).mRotation = aVar4;
    (this->sTexEmissive).mMapMode = aVar5;
    (this->sTexEmissive).bPrivate = bVar6;
    *(undefined3 *)&(this->sTexEmissive).field_0x41 = uVar7;
    (this->sTexEmissive).iUVSrc = iVar8;
    (this->sTexShininess).mTextureBlend = (other->sTexShininess).mTextureBlend;
    std::__cxx11::string::operator=
              ((string *)&(this->sTexShininess).mMapName,(string *)&(other->sTexShininess).mMapName)
    ;
    aVar1 = (other->sTexShininess).mOffsetV;
    aVar2 = (other->sTexShininess).mScaleU;
    aVar3 = (other->sTexShininess).mScaleV;
    aVar4 = (other->sTexShininess).mRotation;
    aVar5 = (other->sTexShininess).mMapMode;
    bVar6 = (other->sTexShininess).bPrivate;
    uVar7 = *(undefined3 *)&(other->sTexShininess).field_0x41;
    iVar8 = (other->sTexShininess).iUVSrc;
    (this->sTexShininess).mOffsetU = (other->sTexShininess).mOffsetU;
    (this->sTexShininess).mOffsetV = aVar1;
    (this->sTexShininess).mScaleU = aVar2;
    (this->sTexShininess).mScaleV = aVar3;
    (this->sTexShininess).mRotation = aVar4;
    (this->sTexShininess).mMapMode = aVar5;
    (this->sTexShininess).bPrivate = bVar6;
    *(undefined3 *)&(this->sTexShininess).field_0x41 = uVar7;
    (this->sTexShininess).iUVSrc = iVar8;
    this->mBumpHeight = other->mBumpHeight;
    (this->mEmissive).r = (other->mEmissive).r;
    (this->mEmissive).g = (other->mEmissive).g;
    (this->mEmissive).b = (other->mEmissive).b;
    (this->sTexAmbient).mTextureBlend = (other->sTexAmbient).mTextureBlend;
    std::__cxx11::string::operator=
              ((string *)&(this->sTexAmbient).mMapName,(string *)&(other->sTexAmbient).mMapName);
    aVar1 = (other->sTexAmbient).mOffsetV;
    aVar2 = (other->sTexAmbient).mScaleU;
    aVar3 = (other->sTexAmbient).mScaleV;
    aVar4 = (other->sTexAmbient).mRotation;
    aVar5 = (other->sTexAmbient).mMapMode;
    bVar6 = (other->sTexAmbient).bPrivate;
    uVar7 = *(undefined3 *)&(other->sTexAmbient).field_0x41;
    iVar8 = (other->sTexAmbient).iUVSrc;
    (this->sTexAmbient).mOffsetU = (other->sTexAmbient).mOffsetU;
    (this->sTexAmbient).mOffsetV = aVar1;
    (this->sTexAmbient).mScaleU = aVar2;
    (this->sTexAmbient).mScaleV = aVar3;
    (this->sTexAmbient).mRotation = aVar4;
    (this->sTexAmbient).mMapMode = aVar5;
    (this->sTexAmbient).bPrivate = bVar6;
    *(undefined3 *)&(this->sTexAmbient).field_0x41 = uVar7;
    (this->sTexAmbient).iUVSrc = iVar8;
    this->mTwoSided = other->mTwoSided;
  }
  return this;
}

Assistant:

Material &operator=(Material &&other) AI_NO_EXCEPT {
        if (this == &other) {
            return *this;
        }

        mName = std::move(other.mName);
        mDiffuse = std::move(other.mDiffuse);
        mSpecularExponent = std::move(other.mSpecularExponent);
        mShininessStrength = std::move(other.mShininessStrength),
        mSpecular = std::move(other.mSpecular);
        mAmbient = std::move(other.mAmbient);
        mShading = std::move(other.mShading);
        mTransparency = std::move(other.mTransparency);
        sTexDiffuse = std::move(other.sTexDiffuse);
        sTexOpacity = std::move(other.sTexOpacity);
        sTexSpecular = std::move(other.sTexSpecular);
        sTexReflective = std::move(other.sTexReflective);
        sTexBump = std::move(other.sTexBump);
        sTexEmissive = std::move(other.sTexEmissive);
        sTexShininess = std::move(other.sTexShininess);
        mBumpHeight = std::move(other.mBumpHeight);
        mEmissive = std::move(other.mEmissive);
        sTexAmbient = std::move(other.sTexAmbient);
        mTwoSided = std::move(other.mTwoSided);

        return *this;
    }